

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O2

void * __thiscall
google::protobuf::internal::ThreadSafeArena::AllocateAlignedFallback
          (ThreadSafeArena *this,size_t n,type_info *type)

{
  ulong uVar1;
  long *plVar2;
  bool bVar3;
  SerialArena *in_RAX;
  void *pvVar4;
  undefined8 *in_FS_OFFSET;
  SerialArena *arena;
  SerialArena *local_18;
  
  if ((*(ulong *)(this + 8) & 2) != 0) {
    plVar2 = *(long **)((*(ulong *)(this + 8) & 0xfffffffffffffff8) + 0x20);
    local_18 = in_RAX;
    (**(code **)(*plVar2 + 0x10))(plVar2,type,n);
    bVar3 = GetSerialArenaFast(this,&local_18);
    if (bVar3) {
      uVar1 = *(ulong *)(this + 8);
      goto LAB_0032fe13;
    }
  }
  local_18 = GetSerialArenaFallback(this,(void *)*in_FS_OFFSET);
  uVar1 = *(ulong *)(this + 8);
LAB_0032fe13:
  pvVar4 = SerialArena::AllocateAligned(local_18,n,(AllocationPolicy *)(uVar1 & 0xfffffffffffffff8))
  ;
  return pvVar4;
}

Assistant:

PROTOBUF_NOINLINE
void* ThreadSafeArena::AllocateAlignedFallback(size_t n,
                                               const std::type_info* type) {
  if (alloc_policy_.should_record_allocs()) {
    alloc_policy_.RecordAlloc(type, n);
    SerialArena* arena;
    if (PROTOBUF_PREDICT_TRUE(GetSerialArenaFast(&arena))) {
      return arena->AllocateAligned(n, alloc_policy_.get());
    }
  }
  return GetSerialArenaFallback(&thread_cache())
      ->AllocateAligned(n, alloc_policy_.get());
}